

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

Status google::protobuf::json_internal::anon_unknown_5::
       ParseMap<google::protobuf::json_internal::ParseProto2Descriptor>
                 (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto2Descriptor> field
                 ,Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  int *piVar1;
  string **ppsVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  FieldDescriptor *pFVar6;
  string *psVar7;
  Msg *in_RCX;
  uint *out;
  Status *_status;
  char *in_R8;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view literal;
  string_view literal_00;
  Metadata MVar8;
  string_view sVar9;
  string_view x;
  bool local_172;
  int64_t n;
  size_t local_160;
  char *local_148;
  Descriptor *local_140;
  string_view local_138;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_128;
  char *local_120;
  undefined8 local_118;
  undefined8 local_100;
  undefined8 local_f8;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  string_view local_78;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_seen;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  insert_result;
  
  bVar3 = JsonLexer::Peek((JsonLexer *)field,kNull);
  if (bVar3) {
    JsonLexer::Expect(lex,field,4,"null");
    return (Status)(uintptr_t)lex;
  }
  keys_seen.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  keys_seen.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  keys_seen.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control =
       (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  JsonLexer::Expect(lex,field,1,"{");
  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
    absl::lts_20240722::Status::~Status((Status *)lex);
    JsonLexer::Push(lex);
    if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
      absl::lts_20240722::Status::~Status((Status *)lex);
      sVar9._M_str = "}";
      sVar9._M_len = 1;
      bVar3 = JsonLexer::Peek((JsonLexer *)field,sVar9);
      if (bVar3) {
        piVar1 = (int *)((long)&field->field_22 + 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        ppsVar2 = &field[1].all_names_;
        local_172 = true;
        local_148 = "expected \',\'";
        do {
          if (local_172 == false) goto LAB_00292b7a;
          JsonLexer::SkipToToken(lex);
          if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00292b8f;
          absl::lts_20240722::Status::~Status((Status *)lex);
          absl::lts_20240722::
          StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          cVar4 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field);
          if ((cVar4 == '\"') ||
             (cVar4 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field),
             cVar4 == '\'')) {
            JsonLexer::ParseUtf8
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&local_128.status_,(JsonLexer *)field);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=(&key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&local_128.status_);
LAB_0029267f:
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&local_128.status_);
            absl::lts_20240722::Status::Status
                      ((Status *)lex,
                       (Status *)
                       &key.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      );
            if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00292a51;
            absl::lts_20240722::Status::~Status((Status *)lex);
            JsonLexer::Expect(lex,field,1);
            if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00292a51;
            absl::lts_20240722::Status::~Status((Status *)lex);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::EnsureOk(&key.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      );
            piVar1 = (int *)((long)&(field[1].scope_.containing_oneof)->all_names_[-1].field_2 + 8);
            *piVar1 = *piVar1 + 1;
            _local_128 = MaybeOwnedString::AsView
                                   (&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1.data_.value);
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                      (&insert_result,
                       &keys_seen.
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,(basic_string_view<char,_std::char_traits<char>_> *)&local_128.status_);
            if (insert_result.second == false) {
              n = (int64_t)anon_var_dwarf_6ff29a;
              local_160 = 0x30;
              local_138 = MaybeOwnedString::AsView
                                    (&key.
                                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                      .field_1.data_.value);
              absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                        ((string *)&local_128.status_,
                         (FormatSpec<std::basic_string_view<char>_> *)&n,&local_138);
              JsonLocation::Invalid
                        ((JsonLocation *)lex,
                         (undefined1 *)
                         ((long)&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1 + 0x30),local_120,local_128);
              std::__cxx11::string::~string((string *)&local_128.status_);
            }
            else {
              ParseProto2Descriptor::RecordAsSeen((Field)msg,in_RCX);
              bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)msg);
              if (bVar3) {
                MVar8 = Message::GetMetadata(in_RCX->msg_);
                local_128 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                             )Reflection::AddMessage
                                        (MVar8.reflection,in_RCX->msg_,(FieldDescriptor *)msg,
                                         (MessageFactory *)0x0);
              }
              else {
                MVar8 = Message::GetMetadata(in_RCX->msg_);
                local_128 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                             )Reflection::MutableMessage
                                        (MVar8.reflection,in_RCX->msg_,(FieldDescriptor *)msg,
                                         (MessageFactory *)0x0);
              }
              local_120 = (char *)0x1;
              local_118 = 0;
              local_100 = 1;
              local_f8 = 0;
              local_140 = FieldDescriptor::message_type((FieldDescriptor *)msg);
              pFVar6 = Descriptor::map_key(local_140);
              out = &switchD_00292863::switchdataD_003b20a0;
              switch(pFVar6->type_) {
              case '\x03':
              case '\x10':
              case '\x12':
                sVar9 = MaybeOwnedString::AsView
                                  (&key.
                                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                    .field_1.data_.value);
                str._M_str = (char *)&n;
                str._M_len = (size_t)sVar9._M_str;
                bVar3 = absl::lts_20240722::SimpleAtoi<long>
                                  ((lts_20240722 *)sVar9._M_len,str,(Nonnull<long_*>)out);
                if (bVar3) {
                  ParseProto2Descriptor::SetInt64(pFVar6,(Msg *)&local_128.status_,n);
                  goto LAB_00292a01;
                }
                JsonLocation::Invalid
                          ((JsonLocation *)lex,
                           (undefined1 *)
                           ((long)&key.
                                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   .field_1 + 0x30),0x26,"non-number characters in quoted number");
                break;
              case '\x04':
              case '\x06':
                sVar9 = MaybeOwnedString::AsView
                                  (&key.
                                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                    .field_1.data_.value);
                str_01._M_str = (char *)&n;
                str_01._M_len = (size_t)sVar9._M_str;
                bVar3 = absl::lts_20240722::SimpleAtoi<unsigned_long>
                                  ((lts_20240722 *)sVar9._M_len,str_01,(Nonnull<unsigned_long_*>)out
                                  );
                if (bVar3) {
                  ParseProto2Descriptor::SetUInt64(pFVar6,(Msg *)&local_128.status_,n);
                  goto LAB_00292a01;
                }
                JsonLocation::Invalid
                          ((JsonLocation *)lex,
                           (undefined1 *)
                           ((long)&key.
                                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   .field_1 + 0x30),0x26,"non-number characters in quoted number");
                break;
              case '\x05':
              case '\x0f':
              case '\x11':
                sVar9 = MaybeOwnedString::AsView
                                  (&key.
                                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                    .field_1.data_.value);
                str_00._M_str = (char *)&n;
                str_00._M_len = (size_t)sVar9._M_str;
                bVar3 = absl::lts_20240722::SimpleAtoi<int>
                                  ((lts_20240722 *)sVar9._M_len,str_00,(Nonnull<int_*>)out);
                if (bVar3) {
                  ParseProto2Descriptor::SetInt32(pFVar6,(Msg *)&local_128.status_,(uint32_t)n);
                  goto LAB_00292a01;
                }
                JsonLocation::Invalid
                          ((JsonLocation *)lex,
                           (undefined1 *)
                           ((long)&key.
                                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   .field_1 + 0x30),0x26,"non-number characters in quoted number");
                break;
              case '\a':
              case '\r':
                sVar9 = MaybeOwnedString::AsView
                                  (&key.
                                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                    .field_1.data_.value);
                str_02._M_str = (char *)&n;
                str_02._M_len = (size_t)sVar9._M_str;
                bVar3 = absl::lts_20240722::SimpleAtoi<unsigned_int>
                                  ((lts_20240722 *)sVar9._M_len,str_02,out);
                if (bVar3) {
                  ParseProto2Descriptor::SetUInt32(pFVar6,(Msg *)&local_128.status_,(uint32_t)n);
                  goto LAB_00292a01;
                }
                JsonLocation::Invalid
                          ((JsonLocation *)lex,
                           (undefined1 *)
                           ((long)&key.
                                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   .field_1 + 0x30),0x26,"non-number characters in quoted number");
                break;
              case '\b':
                bVar3 = json_internal::operator==
                                  (&key.
                                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                    .field_1.data_.value,(char (*) [5])0x30b93a);
                if ((bVar3) ||
                   (bVar5 = json_internal::operator==
                                      (&key.
                                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                        .field_1.data_.value,(char (*) [6])"false"), bVar5)) {
                  ParseProto2Descriptor::SetBool(pFVar6,(Msg *)&local_128.status_,bVar3);
                  goto LAB_00292a01;
                }
                local_138._M_str = (char *)0x1e;
                local_138._M_len = (size_t)"expected bool string, got \'%s\'";
                local_78 = MaybeOwnedString::AsView
                                     (&key.
                                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                       .field_1.data_.value);
                absl::lts_20240722::
                StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ((string *)&n,(FormatSpec<std::basic_string_view<char>_> *)&local_138,
                           &local_78);
                JsonLocation::Invalid
                          ((JsonLocation *)lex,
                           (undefined1 *)
                           ((long)&key.
                                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   .field_1 + 0x30),local_160,n);
                std::__cxx11::string::~string((string *)&n);
                break;
              case '\t':
                psVar7 = MaybeOwnedString::ToString_abi_cxx11_
                                   (&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1.data_.value);
                x._M_str = in_R8;
                x._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
                ParseProto2Descriptor::SetString
                          ((ParseProto2Descriptor *)pFVar6,(Field)&local_128.status_,
                           (Msg *)psVar7->_M_string_length,x);
LAB_00292a01:
                pFVar6 = Descriptor::map_value(local_140);
                ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                          (lex,field,
                           (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)pFVar6);
                break;
              default:
                JsonLocation::Invalid((JsonLocation *)lex,ppsVar2,0x18,"unsupported map key type");
              }
              ParseProto2Descriptor::Msg::~Msg((Msg *)&local_128.status_);
            }
            if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00292a51;
            absl::lts_20240722::Status::~Status((Status *)lex);
            literal._M_str = ",";
            literal._M_len = 1;
            local_172 = JsonLexer::Peek((JsonLexer *)field,literal);
            bVar3 = true;
          }
          else {
            if (field[1].super_SymbolBase.symbol_type_ == '\x01') {
              JsonLexer::ParseBareWord
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&local_128.status_,(JsonLexer *)field);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::operator=(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&local_128.status_);
              goto LAB_0029267f;
            }
            JsonLocation::Invalid((JsonLocation *)lex,ppsVar2,0xc,"expected \'\"\'");
LAB_00292a51:
            bVar3 = false;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         );
          if (!bVar3) goto LAB_00292b8f;
          literal_00._M_str = "}";
          literal_00._M_len = 1;
          bVar3 = JsonLexer::Peek((JsonLexer *)field,literal_00);
        } while (!bVar3);
        piVar1 = (int *)((long)&field->field_22 + 4);
        *piVar1 = *piVar1 + 1;
        if ((field[1].super_SymbolBase.symbol_type_ == '\0') && (local_172 != false)) {
          local_148 = "expected \'}\'";
LAB_00292b7a:
          JsonLocation::Invalid((JsonLocation *)lex,ppsVar2,0xc,local_148);
          goto LAB_00292b8f;
        }
      }
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
  }
LAB_00292b8f:
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&keys_seen.
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseMap(JsonLexer& lex, Field<Traits> field, Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::flat_hash_set<std::string> keys_seen;
  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& key) -> absl::Status {
        lex.path().NextRepeated();
        auto insert_result = keys_seen.emplace(key.value.AsView());
        if (!insert_result.second) {
          return key.loc.Invalid(absl::StrFormat(
              "got unexpectedly-repeated repeated map key: '%s'",
              key.value.AsView()));
        }
        return Traits::NewMsg(
            field, msg,
            [&](const Desc<Traits>& type, Msg<Traits>& entry) -> absl::Status {
              auto key_field = Traits::KeyField(type);
              switch (Traits::FieldType(key_field)) {
                case FieldDescriptor::TYPE_INT64:
                case FieldDescriptor::TYPE_SINT64:
                case FieldDescriptor::TYPE_SFIXED64: {
                  int64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT64:
                case FieldDescriptor::TYPE_FIXED64: {
                  uint64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_INT32:
                case FieldDescriptor::TYPE_SINT32:
                case FieldDescriptor::TYPE_SFIXED32: {
                  int32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT32:
                case FieldDescriptor::TYPE_FIXED32: {
                  uint32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_BOOL: {
                  if (key.value == "true") {
                    Traits::SetBool(key_field, entry, true);
                  } else if (key.value == "false") {
                    Traits::SetBool(key_field, entry, false);
                  } else {
                    return key.loc.Invalid(absl::StrFormat(
                        "expected bool string, got '%s'", key.value.AsView()));
                  }
                  break;
                }
                case FieldDescriptor::TYPE_STRING: {
                  Traits::SetString(key_field, entry,
                                    std::move(key.value.ToString()));
                  break;
                }
                default:
                  return lex.Invalid("unsupported map key type");
              }

              return ParseSingular<Traits>(lex, Traits::ValueField(type),
                                           entry);
            });
      });
}